

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O2

void * Abc_ObjMvVar(Abc_Obj_t *pObj)

{
  int iVar1;
  int nCapMin;
  int iVar2;
  void *pvVar3;
  Vec_Att_t *p;
  void **ppvVar4;
  
  pvVar3 = Abc_NtkMvVar(pObj->pNtk);
  if (pvVar3 != (void *)0x0) {
    p = (Vec_Att_t *)Abc_NtkMvVar(pObj->pNtk);
    ppvVar4 = p->pArrayPtr;
    if (ppvVar4 == (void **)0x0) {
      __assert_fail("p->pArrayPtr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecAtt.h"
                    ,0xf9,"void *Vec_AttEntry(Vec_Att_t *, int)");
    }
    iVar1 = pObj->Id;
    if (p->nCap <= iVar1) {
      iVar2 = p->nCap * 2;
      nCapMin = iVar1 + 10;
      if (iVar1 < iVar2) {
        nCapMin = iVar2;
      }
      Vec_AttGrow(p,nCapMin);
      ppvVar4 = p->pArrayPtr;
    }
    if (ppvVar4[iVar1] != (void *)0x0) {
      return ppvVar4[iVar1];
    }
    if (p->pFuncStartObj != (_func_void_ptr_void_ptr *)0x0) {
      pvVar3 = (*p->pFuncStartObj)(p->pMan);
      p->pArrayPtr[iVar1] = pvVar3;
      return p->pArrayPtr[iVar1];
    }
  }
  return (void *)0x0;
}

Assistant:

static inline void *      Abc_ObjMvVar( Abc_Obj_t * pObj )              { return Abc_NtkMvVar(pObj->pNtk)? Vec_AttEntry( (Vec_Att_t *)Abc_NtkMvVar(pObj->pNtk), pObj->Id ) : NULL; }